

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFFormFieldObjectHelper::getInheritableFieldValueAsString
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this,string *name)

{
  bool bVar1;
  QPDFObjectHandle fv;
  QPDFObjectHandle local_40;
  string local_30;
  
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&local_40,(string *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = QPDFObjectHandle::isString(&local_40);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_30,&local_40);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getInheritableFieldValueAsString(std::string const& name)
{
    QPDFObjectHandle fv = getInheritableFieldValue(name);
    std::string result;
    if (fv.isString()) {
        result = fv.getUTF8Value();
    }
    return result;
}